

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O1

exp_number __thiscall
ising::free_energy::square::transfer_matrix<double>::product_U
          (transfer_matrix<double> *this,uint_t Ly,real_t_conflict Jx,real_t_conflict beta,
          exp_number *factor,vector<double,_std::allocator<double>_> *v,
          vector<double,_std::allocator<double>_> *v_10,
          vector<double,_std::allocator<double>_> *v_20,
          vector<double,_std::allocator<double>_> *v_01,
          vector<double,_std::allocator<double>_> *v_02,vector<double,_std::allocator<double>_> *vt)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  byte bVar7;
  uint_t uVar8;
  uint_t c0;
  ulong uVar9;
  uint_t c0_1;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  value_type_conflict2 extraout_XMM0_Qa;
  exp_number eVar14;
  exp_number<double> local_40;
  
  uVar11 = (ulong)(1 << ((byte)Ly & 0x1f));
  dVar12 = exp(Jx * beta);
  dVar13 = exp(-beta * Jx);
  if (Ly != 0) {
    uVar8 = 0;
    do {
      bVar7 = (byte)uVar8;
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        uVar10 = uVar9 ^ (long)(1 << (bVar7 & 0x1f));
        pdVar4[uVar9] =
             pdVar3[uVar9] * dVar12 + pdVar3[uVar10] * dVar13 +
             (pdVar1[uVar9] * dVar12 + pdVar1[uVar10] * dVar13) * Jx * Jx +
             (pdVar2[uVar9] * dVar12 + pdVar2[uVar10] * -dVar13) * (Jx + Jx);
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pdVar1 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar3 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar4 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar4;
      (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar1;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar3;
      pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        uVar10 = uVar9 ^ (long)(1 << (bVar7 & 0x1f));
        pdVar1[uVar9] =
             (pdVar4[uVar9] * dVar12 + pdVar4[uVar10] * -dVar13) * Jx +
             pdVar5[uVar9] * dVar12 + pdVar5[uVar10] * dVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pdVar4 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar1;
      (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
      (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar3;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar6;
      pdVar1 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        pdVar4[uVar9] =
             pdVar1[uVar9] * dVar12 + pdVar1[uVar9 ^ (long)(1 << (bVar7 & 0x1f))] * dVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pdVar1 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar3 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar6;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar1;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar3;
      pdVar4 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        pdVar1[uVar9] =
             pdVar4[uVar9] * dVar12 + pdVar4[uVar9 ^ (long)(1 << (bVar7 & 0x1f))] * dVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pdVar4 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar1;
      (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
      (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar3;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar6;
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        pdVar4[uVar9] =
             pdVar1[uVar9] * dVar12 + pdVar1[uVar9 ^ (long)(1 << (bVar7 & 0x1f))] * dVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar6;
      pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar2;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar3;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != Ly);
  }
  dVar12 = 0.0;
  uVar9 = 0;
  do {
    dVar13 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar9];
    dVar12 = dVar12 + dVar13 * dVar13;
    uVar9 = uVar9 + 1;
  } while (uVar11 != uVar9);
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar12 = 1.0 / dVar12;
  pdVar1 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar9 = 0;
  do {
    pdVar1[uVar9] = pdVar1[uVar9] * dVar12;
    pdVar2[uVar9] = pdVar2[uVar9] * dVar12;
    pdVar3[uVar9] = pdVar3[uVar9] * dVar12;
    pdVar4[uVar9] = pdVar4[uVar9] * dVar12;
    pdVar5[uVar9] = pdVar5[uVar9] * dVar12;
    uVar9 = uVar9 + 1;
  } while (uVar11 != uVar9);
  *(value_type_conflict2 *)this = factor->log_;
  *(int32_t *)(this + 8) = factor->sign_;
  standards::exp_number<double>::exp_number(&local_40,dVar12);
  standards::exp_number<double>::operator/=((exp_number<double> *)this,&local_40);
  eVar14._8_8_ = this;
  eVar14.log_ = extraout_XMM0_Qa;
  return eVar14;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }